

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

bool __thiscall hwnet::ThreadPool::TaskQueue::Get(TaskQueue *this,taskque *out)

{
  bool bVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  taskque *out_local;
  TaskQueue *this_local;
  
  guard._M_device = (mutex_type *)out;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx);
  do {
    if ((this->closed & 1U) != 0) {
      bVar1 = std::
              deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
              empty(&this->tasks);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
        swap(&this->tasks,
             (deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_> *)
             guard._M_device);
        this_local._7_1_ = true;
      }
LAB_00158b5b:
      std::lock_guard<std::mutex>::~lock_guard(&local_28);
      return this_local._7_1_;
    }
    bVar1 = std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
            ::empty(&this->tasks);
    if (!bVar1) {
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::swap
                (&this->tasks,
                 (deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                  *)guard._M_device);
      this_local._7_1_ = true;
      goto LAB_00158b5b;
    }
    this->watting = this->watting + 1;
    std::_V2::condition_variable_any::wait<std::mutex>(&this->cv,&this->mtx);
    this->watting = this->watting + -1;
  } while( true );
}

Assistant:

bool ThreadPool::TaskQueue::Get(ThreadPool::TaskQueue::taskque &out) {
	std::lock_guard<std::mutex> guard(this->mtx);
	for( ; ;) {
		if(this->closed) {
			if(this->tasks.empty()) {
				return false;
			} else {
				this->tasks.swap(out);
				return true;
			}
		} else {
			if(this->tasks.empty()) {
				++this->watting;//增加等待数量
				this->cv.wait(this->mtx);
				--this->watting;//减少正在等待的线程数量
			} else {
				this->tasks.swap(out);
				return true;
			}	
		}
	}
}